

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O1

void __thiscall
CVmObjDate::restore_from_file(CVmObjDate *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *param_3)

{
  int iVar1;
  undefined4 extraout_var;
  char b [4];
  char b_1 [4];
  undefined4 local_20;
  undefined4 local_1c;
  char *pcVar2;
  
  if ((this->super_CVmObject).ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
  }
  iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,8,this);
  pcVar2 = (char *)CONCAT44(extraout_var,iVar1);
  (this->super_CVmObject).ext_ = pcVar2;
  CVmFile::read_bytes(fp,(char *)&local_20,4);
  *(undefined4 *)pcVar2 = local_20;
  CVmFile::read_bytes(fp,(char *)&local_1c,4);
  *(undefined4 *)(pcVar2 + 4) = local_1c;
  return;
}

Assistant:

void CVmObjDate::restore_from_file(VMG_ vm_obj_id_t self,
                                   CVmFile *fp, CVmObjFixup *)
{
    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* allocate the extension structure */
    vm_date_ext *ext = vm_date_ext::alloc_ext(vmg_ this);
    ext_ = (char *)ext;

    /* read the data */
    ext->dayno = fp->read_int4();
    ext->daytime = fp->read_uint4();
}